

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_ct_condition_t mbedtls_mpi_core_check_zero_ct(mbedtls_mpi_uint *A,size_t limbs)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  
  uVar1 = 0;
  for (sVar2 = 0; limbs != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 | A[sVar2];
  }
  return (long)(-((uVar1 ^ mbedtls_ct_zero) >> 1) | -(uVar1 ^ mbedtls_ct_zero)) >> 0x3f;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_check_zero_ct(const mbedtls_mpi_uint *A,
                                                      size_t limbs)
{
    volatile const mbedtls_mpi_uint *force_read_A = A;
    mbedtls_mpi_uint bits = 0;

    for (size_t i = 0; i < limbs; i++) {
        bits |= force_read_A[i];
    }

    return mbedtls_ct_bool(bits);
}